

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * __thiscall
testing::internal::FlagToEnvVar_abi_cxx11_(string *__return_storage_ptr__,internal *this,char *flag)

{
  Message *pMVar1;
  long lVar2;
  long in_FS_OFFSET;
  long local_70;
  size_t i;
  char local_49;
  Message local_48;
  Message env_var;
  internal *local_38;
  char *flag_local;
  string full_flag;
  
  full_flag.field_2._8_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  local_38 = this;
  Message::Message(&env_var);
  pMVar1 = Message::operator<<(&env_var,(char (*) [7])"gtest_");
  pMVar1 = Message::operator<<(pMVar1,(char **)&local_38);
  Message::GetString_abi_cxx11_((string *)&flag_local,pMVar1);
  Message::~Message(&env_var);
  Message::Message(&local_48);
  local_70 = 0;
  while( true ) {
    lVar2 = std::__cxx11::string::length();
    if (local_70 == lVar2) break;
    lVar2 = std::__cxx11::string::c_str();
    local_49 = ToUpper(*(char *)(lVar2 + local_70));
    Message::operator<<(&local_48,&local_49);
    local_70 = local_70 + 1;
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,&local_48);
  Message::~Message(&local_48);
  std::__cxx11::string::~string((string *)&flag_local);
  if (*(long *)(in_FS_OFFSET + 0x28) == full_flag.field_2._8_8_) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}